

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.h
# Opt level: O3

void __thiscall
wasm::SuffixTree::RepeatedSubstringIterator::RepeatedSubstringIterator
          (RepeatedSubstringIterator *this,SuffixTreeInternalNode *N)

{
  SuffixTreeInternalNode *local_30;
  SuffixTreeInternalNode *N_local;
  
  this->N = &N->super_SuffixTreeNode;
  (this->RS).StartIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RS).StartIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RS).StartIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->InternalNodesToVisit).
  super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->InternalNodesToVisit).
  super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->InternalNodesToVisit).
  super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->MinLength = 2;
  if (N != (SuffixTreeInternalNode *)0x0) {
    local_30 = N;
    std::vector<wasm::SuffixTreeInternalNode*,std::allocator<wasm::SuffixTreeInternalNode*>>::
    _M_realloc_insert<wasm::SuffixTreeInternalNode*const&>
              ((vector<wasm::SuffixTreeInternalNode*,std::allocator<wasm::SuffixTreeInternalNode*>>
                *)&this->InternalNodesToVisit,(iterator)0x0,&local_30);
    advance(this);
  }
  return;
}

Assistant:

RepeatedSubstringIterator(SuffixTreeInternalNode* N) : N(N) {
      // Do we have a non-null node?
      if (!N) {
        return;
      }
      // Yes. At the first step, we need to visit all of N's children.
      // Note: This means that we visit N last.
      InternalNodesToVisit.push_back(N);
      advance();
    }